

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::ILikeOperator,bool>
               (string_t *ldata,string_t *rdata,bool *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  sel_t *psVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  ulong uVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  _Head_base<0UL,_unsigned_long_*,_false> _Var10;
  ulong uVar11;
  idx_t idx_in_entry;
  ulong uVar12;
  anon_union_16_2_67f50693_for_value local_68;
  bool *local_58;
  anon_union_16_2_67f50693_for_value local_50;
  buffer_ptr<ValidityBuffer> *local_40;
  string_t *local_38;
  
  local_58 = result_data;
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar1 = lsel->sel_vector;
      psVar2 = rsel->sel_vector;
      uVar12 = 0;
      do {
        uVar8 = uVar12;
        if (psVar1 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar1[uVar12];
        }
        uVar11 = uVar12;
        if (psVar2 != (sel_t *)0x0) {
          uVar11 = (ulong)psVar2[uVar12];
        }
        local_68._0_8_ = *(undefined8 *)&ldata[uVar8].value;
        local_68.pointer.ptr = ldata[uVar8].value.pointer.ptr;
        local_50._0_8_ = *(undefined8 *)&rdata[uVar11].value;
        local_50.pointer.ptr = rdata[uVar11].value.pointer.ptr;
        bVar7 = ILikeOperatorFunction
                          ((string_t *)&local_68.pointer,(string_t *)&local_50.pointer,'\0');
        local_58[uVar12] = bVar7;
        uVar12 = uVar12 + 1;
      } while (count != uVar12);
    }
  }
  else if (count != 0) {
    psVar1 = lsel->sel_vector;
    psVar2 = rsel->sel_vector;
    local_40 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar12 = 0;
    local_38 = rdata;
    do {
      uVar8 = uVar12;
      if (psVar1 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar1[uVar12];
      }
      uVar11 = uVar12;
      if (psVar2 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar2[uVar12];
      }
      puVar3 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)) &&
         ((puVar3 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
          puVar3 == (unsigned_long *)0x0 || ((puVar3[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0)))) {
        local_68._0_8_ = *(undefined8 *)&ldata[uVar8].value;
        local_68.pointer.ptr = ldata[uVar8].value.pointer.ptr;
        local_50._0_8_ = *(undefined8 *)&rdata[uVar11].value;
        local_50.pointer.ptr = rdata[uVar11].value.pointer.ptr;
        bVar7 = ILikeOperatorFunction
                          ((string_t *)&local_68.pointer,(string_t *)&local_50.pointer,'\0');
        local_58[uVar12] = bVar7;
      }
      else {
        _Var10._M_head_impl =
             (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var10._M_head_impl == (unsigned_long *)0x0) {
          local_50._0_8_ = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_68.pointer,(unsigned_long *)&local_50);
          uVar6 = local_68.pointer.ptr;
          uVar5 = local_68._0_8_;
          local_68._0_8_ = (element_type *)0x0;
          local_68.pointer.ptr = (char *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)uVar5;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.pointer.ptr !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.pointer.ptr);
          }
          pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_40);
          _Var10._M_head_impl =
               (pTVar9->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var10._M_head_impl;
          rdata = local_38;
        }
        bVar4 = (byte)uVar12 & 0x3f;
        _Var10._M_head_impl[uVar12 >> 6] =
             _Var10._M_head_impl[uVar12 >> 6] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4)
        ;
      }
      uVar12 = uVar12 + 1;
    } while (count != uVar12);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}